

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDbvt.cpp
# Opt level: O2

void __thiscall btDbvt::clear(btDbvt *this)

{
  if (this->m_root != (btDbvtNode *)0x0) {
    recursedeletenode(this,this->m_root);
  }
  btAlignedFreeInternal(this->m_free);
  this->m_free = (btDbvtNode *)0x0;
  this->m_lkhd = -1;
  btAlignedObjectArray<btDbvt::sStkNN>::clear(&this->m_stkStack);
  this->m_opath = 0;
  return;
}

Assistant:

void			btDbvt::clear()
{
	if(m_root)	
		recursedeletenode(this,m_root);
	btAlignedFree(m_free);
	m_free=0;
	m_lkhd		=	-1;
	m_stkStack.clear();
	m_opath		=	0;
	
}